

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O0

bool __thiscall crnlib::dds_comp::create_dds_tex(dds_comp *this,mipmapped_texture *dds_tex)

{
  uint width_00;
  uint height_00;
  conversion_type conv_type_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  vector<crnlib::vector<crnlib::mip_level_*>_> *this_01;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_1320;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_12c0;
  image_u8 *pImage;
  mip_level *pMip;
  uint level_index_3;
  uint face_index_3;
  face_vec faces;
  image_u8 cooked_image;
  uint level_index_2;
  uint face_index_2;
  conversion_type conv_type;
  uint level_index_1;
  uint face_index_1;
  uint height;
  uint width;
  uint level_index;
  uint face_index;
  bool has_alpha;
  undefined1 local_1228 [8];
  image_u8 images [6] [16];
  mipmapped_texture *dds_tex_local;
  dds_comp *this_local;
  
  local_12c0 = (image<crnlib::color_quad<unsigned_char,_int>_> *)local_1228;
  do {
    image<crnlib::color_quad<unsigned_char,_int>_>::image(local_12c0);
    local_12c0 = local_12c0 + 1;
  } while (local_12c0 !=
           (image<crnlib::color_quad<unsigned_char,_int>_> *)&images[5][0xf].m_pixel_buf.m_size);
  level_index._3_1_ = false;
  width = 0;
  do {
    if (this->m_pParams->m_faces <= width) {
      for (conv_type = cConversion_To_CCxY; (uint)conv_type < this->m_pParams->m_faces;
          conv_type = conv_type + cConversion_From_CCxY) {
        for (face_index_2 = 0; face_index_2 < this->m_pParams->m_levels;
            face_index_2 = face_index_2 + 1) {
          image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                     &images[(ulong)(uint)conv_type - 1][(ulong)face_index_2 + 0xf].m_pixel_buf.
                      m_size,3,level_index._3_1_);
        }
      }
      conv_type_00 = image_utils::get_image_conversion_type_from_crn_format
                               (this->m_pParams->m_format);
      if (conv_type_00 != cConversion_Invalid) {
        for (cooked_image.m_pixel_buf.m_capacity = 0;
            cooked_image.m_pixel_buf.m_capacity < this->m_pParams->m_faces;
            cooked_image.m_pixel_buf.m_capacity = cooked_image.m_pixel_buf.m_capacity + 1) {
          for (cooked_image.m_pixel_buf.m_size = 0;
              cooked_image.m_pixel_buf.m_size < this->m_pParams->m_levels;
              cooked_image.m_pixel_buf.m_size = cooked_image.m_pixel_buf.m_size + 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&faces.m_size,
                       (image<crnlib::color_quad<unsigned_char,_int>_> *)
                       &images[(ulong)cooked_image.m_pixel_buf.m_capacity - 1]
                        [(ulong)cooked_image.m_pixel_buf.m_size + 0xf].m_pixel_buf.m_size);
            image_utils::convert_image((image_u8 *)&faces.m_size,conv_type_00);
            image<crnlib::color_quad<unsigned_char,_int>_>::swap
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                       &images[(ulong)cooked_image.m_pixel_buf.m_capacity - 1]
                        [(ulong)cooked_image.m_pixel_buf.m_size + 0xf].m_pixel_buf.m_size,
                       (image<crnlib::color_quad<unsigned_char,_int>_> *)&faces.m_size);
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&faces.m_size);
          }
        }
      }
      this_01 = (vector<crnlib::vector<crnlib::mip_level_*>_> *)&level_index_3;
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector(this_01,this->m_pParams->m_faces);
      for (pMip._4_4_ = 0; pMip._4_4_ < this->m_pParams->m_faces; pMip._4_4_ = pMip._4_4_ + 1) {
        for (pMip._0_4_ = 0; (uint)pMip < this->m_pParams->m_levels; pMip._0_4_ = (uint)pMip + 1) {
          pImage = (image_u8 *)crnlib_new<crnlib::mip_level>();
          this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                    crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                              ((crnlib *)this_01);
          image<crnlib::color_quad<unsigned_char,_int>_>::swap
                    (this_00,(image<crnlib::color_quad<unsigned_char,_int>_> *)
                             &images[(ulong)pMip._4_4_ - 1][(ulong)(uint)pMip + 0xf].m_pixel_buf.
                              m_size);
          mip_level::assign((mip_level *)pImage,this_00,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
          this_01 = (vector<crnlib::vector<crnlib::mip_level_*>_> *)
                    vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)&level_index_3,
                               pMip._4_4_);
          vector<crnlib::mip_level_*>::push_back
                    ((vector<crnlib::mip_level_*> *)this_01,(mip_level **)&pImage);
        }
      }
      mipmapped_texture::assign(dds_tex,(face_vec *)&level_index_3);
      this_local._7_1_ = true;
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)&level_index_3);
LAB_001bbc6a:
      local_1320 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
                   &images[5][0xf].m_pixel_buf.m_size;
      do {
        local_1320 = local_1320 + -1;
        image<crnlib::color_quad<unsigned_char,_int>_>::~image(local_1320);
      } while (local_1320 != (image<crnlib::color_quad<unsigned_char,_int>_> *)local_1228);
      return this_local._7_1_;
    }
    for (height = 0; height < this->m_pParams->m_levels; height = height + 1) {
      width_00 = math::maximum<unsigned_int>(1,this->m_pParams->m_width >> ((byte)height & 0x1f));
      height_00 = math::maximum<unsigned_int>(1,this->m_pParams->m_height >> ((byte)height & 0x1f));
      if (this->m_pParams->m_pImages[width][height] == (crn_uint32 *)0x0) {
        this_local._7_1_ = false;
        goto LAB_001bbc6a;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::alias
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                 &images[(ulong)width - 1][(ulong)height + 0xf].m_pixel_buf.m_size,
                 (color_quad<unsigned_char,_int> *)this->m_pParams->m_pImages[width][height],
                 width_00,height_00,0xffffffff,0xf);
      if (level_index._3_1_ == false) {
        level_index._3_1_ =
             image_utils::has_alpha
                       ((image_u8 *)
                        &images[(ulong)width - 1][(ulong)height + 0xf].m_pixel_buf.m_size);
      }
    }
    width = width + 1;
  } while( true );
}

Assistant:

bool dds_comp::create_dds_tex(mipmapped_texture& dds_tex)
    {
        image_u8 images[cCRNMaxFaces][cCRNMaxLevels];

        bool has_alpha = false;
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);

                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }

                images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
                if (!has_alpha)
                {
                    has_alpha = image_utils::has_alpha(images[face_index][level_index]);
                }
            }
        }

        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                images[face_index][level_index].set_component_valid(3, has_alpha);
            }
        }
        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(images[face_index][level_index]);

                    image_utils::convert_image(cooked_image, conv_type);

                    images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        face_vec faces(m_pParams->m_faces);

        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                mip_level* pMip = crnlib_new<mip_level>();

                image_u8* pImage = crnlib_new<image_u8>();
                pImage->swap(images[face_index][level_index]);
                pMip->assign(pImage);

                faces[face_index].push_back(pMip);
            }
        }

        dds_tex.assign(faces);
#ifdef CRNLIB_BUILD_DEBUG
        CRNLIB_ASSERT(dds_tex.check());
#endif

        return true;
    }